

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::RenderDeviceBase
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          IMemoryAllocator *RawMemAllocator,IEngineFactory *pEngineFactory,
          EngineCreateInfo *EngineCI,GraphicsAdapterInfo *AdapterInfo)

{
  uint uVar1;
  Uint8 UVar2;
  Uint8 UVar3;
  COMPONENT_TYPE CVar4;
  Bool BVar5;
  Uint8 UVar6;
  Uint8 UVar7;
  uint *puVar8;
  TextureFormatAttribs *pTVar9;
  reference pvVar10;
  uint local_17c;
  ushort local_178 [2];
  Uint32 fmt;
  TEXTURE_FORMAT FilterableFormats [37];
  uint local_124;
  undefined1 local_120 [4];
  Uint32 Fmt;
  RefCntWeakPtr<Diligent::DeviceContextVkImpl> local_100;
  STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>
  local_f0;
  RefCntWeakPtr<Diligent::DeviceContextVkImpl> local_d0;
  uint local_bc;
  STDAllocator<bool,_Diligent::IMemoryAllocator> local_b8;
  bool local_95 [13];
  STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator> local_88;
  TextureFormatInfoExt local_68;
  GraphicsAdapterInfo *local_38;
  GraphicsAdapterInfo *AdapterInfo_local;
  EngineCreateInfo *EngineCI_local;
  IEngineFactory *pEngineFactory_local;
  IMemoryAllocator *RawMemAllocator_local;
  IReferenceCounters *pRefCounters_local;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *this_local;
  
  local_38 = AdapterInfo;
  AdapterInfo_local = (GraphicsAdapterInfo *)EngineCI;
  EngineCI_local = (EngineCreateInfo *)pEngineFactory;
  pEngineFactory_local = (IEngineFactory *)RawMemAllocator;
  RawMemAllocator_local = (IMemoryAllocator *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  ObjectBase<Diligent::IRenderDeviceVk>::ObjectBase
            (&this->super_ObjectBase<Diligent::IRenderDeviceVk>,pRefCounters);
  (this->super_ObjectBase<Diligent::IRenderDeviceVk>).
  super_RefCountedObject<Diligent::IRenderDeviceVk>.super_IRenderDeviceVk.super_IRenderDevice.
  super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_010d30c8;
  RefCntAutoPtr<Diligent::IEngineFactory>::RefCntAutoPtr
            (&this->m_pEngineFactory,(IEngineFactory *)EngineCI_local);
  this->m_ValidationFlags = *(VALIDATION_FLAGS *)(AdapterInfo_local->Description + 0x50);
  memcpy(&this->m_AdapterInfo,local_38,0x338);
  RenderDeviceInfo::RenderDeviceInfo(&this->m_DeviceInfo);
  ObjectsRegistry<Diligent::SamplerDesc,_Diligent::RefCntAutoPtr<Diligent::ISampler>,_std::hash<Diligent::SamplerDesc>,_std::equal_to<Diligent::SamplerDesc>_>
  ::ObjectsRegistry(&this->m_SamplersRegistry,0x400);
  local_68.super_TextureFormatInfo.Supported = false;
  local_68.super_TextureFormatInfo.Padding[0] = false;
  local_68.super_TextureFormatInfo.Padding[1] = false;
  local_68.super_TextureFormatInfo.Padding[2] = false;
  local_68.super_TextureFormatInfo.Padding[3] = false;
  local_68.super_TextureFormatInfo.Padding[4] = false;
  local_68.super_TextureFormatInfo.Padding[5] = false;
  local_68.super_TextureFormatInfo.Padding[6] = false;
  local_68.BindFlags = BIND_NONE;
  local_68.Dimensions = RESOURCE_DIMENSION_SUPPORT_NONE;
  local_68.super_TextureFormatInfo.super_TextureFormatAttribs.Name = (Char *)0x0;
  local_68.super_TextureFormatInfo.super_TextureFormatAttribs.Format = TEX_FORMAT_UNKNOWN;
  local_68.super_TextureFormatInfo.super_TextureFormatAttribs.ComponentSize = '\0';
  local_68.super_TextureFormatInfo.super_TextureFormatAttribs.NumComponents = '\0';
  local_68.super_TextureFormatInfo.super_TextureFormatAttribs.ComponentType =
       COMPONENT_TYPE_UNDEFINED;
  local_68.super_TextureFormatInfo.super_TextureFormatAttribs.IsTypeless = false;
  local_68.super_TextureFormatInfo.super_TextureFormatAttribs.BlockWidth = '\0';
  local_68.super_TextureFormatInfo.super_TextureFormatAttribs.BlockHeight = '\0';
  local_68.SampleCounts = SAMPLE_COUNT_NONE;
  local_68.Filterable = false;
  local_68._34_6_ = 0;
  TextureFormatInfoExt::TextureFormatInfoExt(&local_68);
  STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>::STDAllocator
            (&local_88,(IMemoryAllocator *)pEngineFactory_local,
             "Allocator for vector<TextureFormatInfoExt>",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
             ,0x8d);
  std::
  vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ::vector(&this->m_TextureFormatsInfo,0x6a,&local_68,&local_88);
  local_95[0] = false;
  STDAllocator<bool,_Diligent::IMemoryAllocator>::STDAllocator
            (&local_b8,(IMemoryAllocator *)pEngineFactory_local,"Allocator for vector<bool>",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
             ,0x8e);
  std::vector<bool,_Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>::vector
            (&this->m_TexFmtInfoInitFlags,0x6a,local_95,&local_b8);
  local_bc = 1;
  puVar8 = std::max<unsigned_int>(&local_bc,(uint *)(AdapterInfo_local->Description + 0x18));
  uVar1 = *puVar8;
  RefCntWeakPtr<Diligent::DeviceContextVkImpl>::RefCntWeakPtr(&local_d0);
  STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>::
  STDAllocator(&local_f0,(IMemoryAllocator *)pEngineFactory_local,
               "Allocator for vector<RefCntWeakPtr<DeviceContextImplType>>",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x8f);
  std::
  vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
  ::vector(&this->m_wpImmediateContexts,(ulong)uVar1,&local_d0,&local_f0);
  RefCntWeakPtr<Diligent::DeviceContextVkImpl>::~RefCntWeakPtr(&local_d0);
  std::mutex::mutex(&this->m_DeferredCtxMtx);
  uVar1 = *(uint *)(AdapterInfo_local->Description + 0x1c);
  RefCntWeakPtr<Diligent::DeviceContextVkImpl>::RefCntWeakPtr(&local_100);
  STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>::
  STDAllocator((STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>
                *)local_120,(IMemoryAllocator *)pEngineFactory_local,
               "Allocator for vector<RefCntWeakPtr<DeviceContextImplType>>",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x90);
  std::
  vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
  ::vector(&this->m_wpDeferredContexts,(ulong)uVar1,&local_100,
           (STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>
            *)local_120);
  RefCntWeakPtr<Diligent::DeviceContextVkImpl>::~RefCntWeakPtr(&local_100);
  this->m_RawMemAllocator = (IMemoryAllocator *)pEngineFactory_local;
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_TexObjAllocator,(IMemoryAllocator *)pEngineFactory_local,0xf0,0x10);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_TexViewObjAllocator,(IMemoryAllocator *)pEngineFactory_local,0x80,0x20);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_BufObjAllocator,(IMemoryAllocator *)pEngineFactory_local,200,0x10);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_BuffViewObjAllocator,(IMemoryAllocator *)pEngineFactory_local,0x70,0x20);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_ShaderObjAllocator,(IMemoryAllocator *)pEngineFactory_local,0xb8,0x10);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_SamplerObjAllocator,(IMemoryAllocator *)pEngineFactory_local,0x78,0x20);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_PSOAllocator,(IMemoryAllocator *)pEngineFactory_local,0x108,0x10);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_SRBAllocator,(IMemoryAllocator *)pEngineFactory_local,0x68,0x40);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_ResMappingAllocator,(IMemoryAllocator *)pEngineFactory_local,0x70,8);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_FenceAllocator,(IMemoryAllocator *)pEngineFactory_local,0xe0,0x10);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_QueryAllocator,(IMemoryAllocator *)pEngineFactory_local,0x60,0x10);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_RenderPassAllocator,(IMemoryAllocator *)pEngineFactory_local,0xa0,0x10);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_FramebufferAllocator,(IMemoryAllocator *)pEngineFactory_local,0x80,0x10);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_BLASAllocator,(IMemoryAllocator *)pEngineFactory_local,0x120,8);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_TLASAllocator,(IMemoryAllocator *)pEngineFactory_local,0x128,8);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_SBTAllocator,(IMemoryAllocator *)pEngineFactory_local,0x130,8);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_PipeResSignAllocator,(IMemoryAllocator *)pEngineFactory_local,0x118,0x10);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_MemObjAllocator,(IMemoryAllocator *)pEngineFactory_local,0x68,0x10);
  FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
            (&this->m_PSOCacheAllocator,(IMemoryAllocator *)pEngineFactory_local,0x50,4);
  RefCntAutoPtr<Diligent::IThreadPool>::RefCntAutoPtr(&this->m_pShaderCompilationThreadPool);
  std::atomic<int>::atomic(&this->m_UniqueId,0);
  std::atomic<unsigned_int>::atomic(&this->m_NextDynamicBufferId,0);
  Threading::SpinLock::SpinLock(&this->m_RecycledDynamicBufferIdsLock);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->m_RecycledDynamicBufferIds);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&this->m_DbgRecycledDynamicBufferIds);
  for (local_124 = 0; local_124 < 0x6a; local_124 = local_124 + 1) {
    pTVar9 = GetTextureFormatAttribs((TEXTURE_FORMAT)local_124);
    pvVar10 = std::
              vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
              ::operator[](&this->m_TextureFormatsInfo,(ulong)local_124);
    (pvVar10->super_TextureFormatInfo).super_TextureFormatAttribs.Name = pTVar9->Name;
    UVar2 = pTVar9->ComponentSize;
    UVar3 = pTVar9->NumComponents;
    CVar4 = pTVar9->ComponentType;
    BVar5 = pTVar9->IsTypeless;
    UVar6 = pTVar9->BlockWidth;
    UVar7 = pTVar9->BlockHeight;
    (pvVar10->super_TextureFormatInfo).super_TextureFormatAttribs.Format = pTVar9->Format;
    (pvVar10->super_TextureFormatInfo).super_TextureFormatAttribs.ComponentSize = UVar2;
    (pvVar10->super_TextureFormatInfo).super_TextureFormatAttribs.NumComponents = UVar3;
    (pvVar10->super_TextureFormatInfo).super_TextureFormatAttribs.ComponentType = CVar4;
    (pvVar10->super_TextureFormatInfo).super_TextureFormatAttribs.IsTypeless = BVar5;
    (pvVar10->super_TextureFormatInfo).super_TextureFormatAttribs.BlockWidth = UVar6;
    (pvVar10->super_TextureFormatInfo).super_TextureFormatAttribs.BlockHeight = UVar7;
  }
  memcpy(local_178,&DAT_00c21c70,0x4a);
  for (local_17c = 0; local_17c < 0x25; local_17c = local_17c + 1) {
    pvVar10 = std::
              vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
              ::operator[](&this->m_TextureFormatsInfo,(ulong)local_178[local_17c]);
    pvVar10->Filterable = true;
  }
  return;
}

Assistant:

RenderDeviceBase(IReferenceCounters*        pRefCounters,
                     IMemoryAllocator&          RawMemAllocator,
                     IEngineFactory*            pEngineFactory,
                     const EngineCreateInfo&    EngineCI,
                     const GraphicsAdapterInfo& AdapterInfo) :
        // clang-format off
        TObjectBase           {pRefCounters},
        m_pEngineFactory      {pEngineFactory},
        m_ValidationFlags     {EngineCI.ValidationFlags},
        m_AdapterInfo         {AdapterInfo},
        m_TextureFormatsInfo  (TEX_FORMAT_NUM_FORMATS, TextureFormatInfoExt(), STD_ALLOCATOR_RAW_MEM(TextureFormatInfoExt, RawMemAllocator, "Allocator for vector<TextureFormatInfoExt>")),
        m_TexFmtInfoInitFlags (TEX_FORMAT_NUM_FORMATS, false, STD_ALLOCATOR_RAW_MEM(bool, RawMemAllocator, "Allocator for vector<bool>")),
        m_wpImmediateContexts ((std::max)(1u, EngineCI.NumImmediateContexts), RefCntWeakPtr<DeviceContextImplType>(), STD_ALLOCATOR_RAW_MEM(RefCntWeakPtr<DeviceContextImplType>, RawMemAllocator, "Allocator for vector<RefCntWeakPtr<DeviceContextImplType>>")),
        m_wpDeferredContexts  (EngineCI.NumDeferredContexts, RefCntWeakPtr<DeviceContextImplType>(), STD_ALLOCATOR_RAW_MEM(RefCntWeakPtr<DeviceContextImplType>, RawMemAllocator, "Allocator for vector<RefCntWeakPtr<DeviceContextImplType>>")),
        m_RawMemAllocator     {RawMemAllocator},
        m_TexObjAllocator     {RawMemAllocator, sizeof(TextureImplType),                   16},
        m_TexViewObjAllocator {RawMemAllocator, sizeof(TextureViewImplType),               32},
        m_BufObjAllocator     {RawMemAllocator, sizeof(BufferImplType),                    16},
        m_BuffViewObjAllocator{RawMemAllocator, sizeof(BufferViewImplType),                32},
        m_ShaderObjAllocator  {RawMemAllocator, sizeof(ShaderImplType),                    16},
        m_SamplerObjAllocator {RawMemAllocator, sizeof(SamplerImplType),                   32},
        m_PSOAllocator        {RawMemAllocator, sizeof(PipelineStateImplType),             16},
        m_SRBAllocator        {RawMemAllocator, sizeof(ShaderResourceBindingImplType),     64},
        m_ResMappingAllocator {RawMemAllocator, sizeof(ResourceMappingImpl),                8},
        m_FenceAllocator      {RawMemAllocator, sizeof(FenceImplType),                     16},
        m_QueryAllocator      {RawMemAllocator, sizeof(QueryImplType),                     16},
        m_RenderPassAllocator {RawMemAllocator, sizeof(RenderPassImplType),                16},
        m_FramebufferAllocator{RawMemAllocator, sizeof(FramebufferImplType),               16},
        m_BLASAllocator       {RawMemAllocator, sizeof(BottomLevelASImplType),              8},
        m_TLASAllocator       {RawMemAllocator, sizeof(TopLevelASImplType),                 8},
        m_SBTAllocator        {RawMemAllocator, sizeof(ShaderBindingTableImplType),         8},
        m_PipeResSignAllocator{RawMemAllocator, sizeof(PipelineResourceSignatureImplType), 16},
        m_MemObjAllocator     {RawMemAllocator, sizeof(DeviceMemoryImplType),              16},
        m_PSOCacheAllocator   {RawMemAllocator, sizeof(PipelineStateCacheImplType),         4}
    // clang-format on
    {
        // Initialize texture format info
        for (Uint32 Fmt = TEX_FORMAT_UNKNOWN; Fmt < TEX_FORMAT_NUM_FORMATS; ++Fmt)
            static_cast<TextureFormatAttribs&>(m_TextureFormatsInfo[Fmt]) = GetTextureFormatAttribs(static_cast<TEXTURE_FORMAT>(Fmt));

        // https://msdn.microsoft.com/en-us/library/windows/desktop/ff471325(v=vs.85).aspx
        TEXTURE_FORMAT FilterableFormats[] =
            {
                TEX_FORMAT_RGBA32_FLOAT, // OpenGL ES3.1 does not require this format to be filterable
                TEX_FORMAT_RGBA16_FLOAT,
                TEX_FORMAT_RGBA16_UNORM,
                TEX_FORMAT_RGBA16_SNORM,
                TEX_FORMAT_RG32_FLOAT, // OpenGL ES3.1 does not require this format to be filterable
                TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS,
                //TEX_FORMAT_R10G10B10A2_UNORM,
                TEX_FORMAT_R11G11B10_FLOAT,
                TEX_FORMAT_RGBA8_UNORM,
                TEX_FORMAT_RGBA8_UNORM_SRGB,
                TEX_FORMAT_RGBA8_SNORM,
                TEX_FORMAT_RG16_FLOAT,
                TEX_FORMAT_RG16_UNORM,
                TEX_FORMAT_RG16_SNORM,
                TEX_FORMAT_R32_FLOAT, // OpenGL ES3.1 does not require this format to be filterable
                TEX_FORMAT_R24_UNORM_X8_TYPELESS,
                TEX_FORMAT_RG8_UNORM,
                TEX_FORMAT_RG8_SNORM,
                TEX_FORMAT_R16_FLOAT,
                TEX_FORMAT_R16_UNORM,
                TEX_FORMAT_R16_SNORM,
                TEX_FORMAT_R8_UNORM,
                TEX_FORMAT_R8_SNORM,
                TEX_FORMAT_A8_UNORM,
                TEX_FORMAT_RGB9E5_SHAREDEXP,
                TEX_FORMAT_RG8_B8G8_UNORM,
                TEX_FORMAT_G8R8_G8B8_UNORM,
                TEX_FORMAT_BC1_UNORM,
                TEX_FORMAT_BC1_UNORM_SRGB,
                TEX_FORMAT_BC2_UNORM,
                TEX_FORMAT_BC2_UNORM_SRGB,
                TEX_FORMAT_BC3_UNORM,
                TEX_FORMAT_BC3_UNORM_SRGB,
                TEX_FORMAT_BC4_UNORM,
                TEX_FORMAT_BC4_SNORM,
                TEX_FORMAT_BC5_UNORM,
                TEX_FORMAT_BC5_SNORM,
                TEX_FORMAT_B5G6R5_UNORM};
        for (Uint32 fmt = 0; fmt < _countof(FilterableFormats); ++fmt)
            m_TextureFormatsInfo[FilterableFormats[fmt]].Filterable = true;
    }